

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void CVmImageLoader::save_synth_export_cb(void *ctx0,CVmHashEntry *entry0)

{
  uint16_t tmp;
  char b [2];
  char buf [5];
  undefined2 local_20;
  char local_1d [5];
  
  local_20 = (undefined2)entry0->len_;
  CVmFile::write_bytes(*ctx0,(char *)&local_20,2);
  CVmFile::write_bytes(*ctx0,entry0->str_,entry0->len_);
  vmb_put_dh(local_1d,(vm_val_t *)(entry0 + 1));
  CVmFile::write_bytes(*ctx0,local_1d,5);
  *(long *)((long)ctx0 + 8) = *(long *)((long)ctx0 + 8) + 1;
  return;
}

Assistant:

void CVmImageLoader::save_synth_export_cb(void *ctx0, CVmHashEntry *entry0)
{
    synth_save_cb_ctx *ctx = (synth_save_cb_ctx *)ctx0;
    CVmHashEntryExport *entry = (CVmHashEntryExport *)entry0;
    char buf[VMB_DATAHOLDER];

    /* write this entry's length and name to the file */
    ctx->fp->write_uint2(entry->getlen());
    ctx->fp->write_bytes(entry->getstr(), entry->getlen());

    /* write the value as a dataholder */
    vmb_put_dh(buf, &entry->val_);
    ctx->fp->write_bytes(buf, VMB_DATAHOLDER);

    /* count the entry */
    ++(ctx->cnt);
}